

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::anon_unknown_13::standard_deviation(double *first,double *last)

{
  anon_class_8_1_54a3980d in_RSI;
  double *in_RDI;
  double *__first;
  double dVar1;
  double variance;
  double m;
  double *in_stack_ffffffffffffffe0;
  
  __first = (double *)mean(in_RDI,(double *)in_RSI.m);
  dVar1 = std::
          accumulate<double_const*,double,Catch::Benchmark::Detail::(anonymous_namespace)::standard_deviation(double_const*,double_const*)::__0>
                    (__first,in_stack_ffffffffffffffe0,(double)__first,in_RSI);
  dVar1 = sqrt(dVar1 / (double)((long)in_RSI.m - (long)in_RDI >> 3));
  return dVar1;
}

Assistant:

static double
                standard_deviation( double const* first, double const* last ) {
                    auto m = Catch::Benchmark::Detail::mean( first, last );
                    double variance =
                        std::accumulate( first,
                                         last,
                                         0.,
                                         [m]( double a, double b ) {
                                             double diff = b - m;
                                             return a + diff * diff;
                                         } ) /
                        ( last - first );
                    return std::sqrt( variance );
                }